

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O2

bool __thiscall Shell::TermAlgebra::finiteDomain(TermAlgebra *this)

{
  uint uVar1;
  ulong uVar2;
  ulong n;
  TermAlgebraConstructor **ppTVar3;
  
  uVar2 = 0;
  do {
    n = uVar2;
    uVar1 = this->_n;
    if (uVar1 <= n) break;
    ppTVar3 = Lib::Array<Shell::TermAlgebraConstructor_*>::operator[](&this->_constrs,n);
    uVar2 = n + 1;
  } while (((*ppTVar3)->_type->_typeArgsArity - 1) + *(int *)(*ppTVar3)->_type->_key == 0);
  return uVar1 <= n;
}

Assistant:

bool TermAlgebra::finiteDomain()
{
  for (unsigned i = 0; i < _n; i++) {
    if (_constrs[i]->arity() > 0) {
      return false;
    }
  }

  return true;
}